

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

lua_Number lj_lib_checknum(lua_State *L,int narg)

{
  int iVar1;
  ulong uVar2;
  TValue *o;
  
  o = L->base + (long)narg + -1;
  if (o < L->top) {
    uVar2 = o->it64 >> 0x2f;
    if (uVar2 < 0xfffffffffffffff3) {
LAB_0011e23f:
      return (lua_Number)o->u64;
    }
    if (uVar2 == 0xfffffffffffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(o->it64 & 0x7fffffffffff),o);
      if (iVar1 != 0) goto LAB_0011e23f;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

lua_Number lj_lib_checknum(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top &&
	(tvisnumber(o) || (tvisstr(o) && lj_strscan_num(strV(o), o)))))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_UNLIKELY(tvisint(o))) {
    lua_Number n = (lua_Number)intV(o);
    setnumV(o, n);
    return n;
  } else {
    return numV(o);
  }
}